

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O1

void __thiscall
gl4cts::anon_unknown_0::PIQBase::ExpectError(PIQBase *this,GLenum expected,long *error)

{
  GLenum GVar1;
  
  if (*error == 0) {
    GVar1 = glu::CallLogWrapper::glGetError
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper);
    if (GVar1 != expected) {
      *error = -1;
      anon_unknown_0::Output("%d error was expected, found: %d.\n",expected,(ulong)GVar1);
      return;
    }
    anon_unknown_0::Output("Found expected error\n");
    *error = 0;
  }
  return;
}

Assistant:

virtual inline void ExpectError(GLenum expected, long& error)
	{
		if (error != NO_ERROR)
			return;
		GLenum tmp = glGetError();
		if (tmp == expected)
		{
			Output("Found expected error\n");
			error = NO_ERROR; // Error is expected
		}
		else
		{
			error = ERROR;
			Output("%d error was expected, found: %d.\n", expected, tmp);
		}
	}